

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

void __thiscall spvtools::opt::Instruction::Instruction(Instruction *this,IRContext *c)

{
  uint32_t uVar1;
  
  (this->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = (Instruction *)0x0;
  (this->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ = (Instruction *)0x0;
  (this->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ = false;
  (this->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase =
       (_func_int **)&PTR__Instruction_003adc30;
  this->context_ = c;
  this->opcode_ = OpNop;
  this->has_type_id_ = false;
  this->has_result_id_ = false;
  uVar1 = IRContext::TakeNextUniqueId(c);
  this->unique_id_ = uVar1;
  (this->operands_).
  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->operands_).
  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->operands_).
  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dbg_line_insts_).
  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dbg_line_insts_).
  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dbg_line_insts_).
  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dbg_scope_).lexical_scope_ = 0;
  (this->dbg_scope_).inlined_at_ = 0;
  return;
}

Assistant:

Instruction::Instruction(IRContext* c)
    : utils::IntrusiveNodeBase<Instruction>(),
      context_(c),
      opcode_(spv::Op::OpNop),
      has_type_id_(false),
      has_result_id_(false),
      unique_id_(c->TakeNextUniqueId()),
      dbg_scope_(kNoDebugScope, kNoInlinedAt) {}